

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O2

void af_glyph_hints_align_strong_points(AF_GlyphHints hints,AF_Dimension dim)

{
  short sVar1;
  uint uVar2;
  AF_Edge_conflict pAVar3;
  long lVar4;
  AF_Edge_conflict pAVar5;
  short sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  AF_Edge_conflict pAVar10;
  AF_Point_conflict point;
  AF_Point_conflict pAVar11;
  AF_Point_conflict pAVar12;
  bool bVar13;
  
  uVar2 = hints->axis[dim].num_edges;
  lVar9 = (long)(int)uVar2;
  if (0 < lVar9) {
    pAVar11 = hints->points;
    pAVar12 = pAVar11 + hints->num_points;
    pAVar3 = hints->axis[dim].edges;
    bVar13 = dim != AF_DIMENSION_HORZ;
    pAVar10 = pAVar3 + lVar9;
    for (; pAVar11 < pAVar12; pAVar11 = pAVar11 + 1) {
      if (((ushort)bVar13 * 4 + 0x14 & pAVar11->flags) == 0) {
        sVar1 = (&pAVar11->fx)[dim == AF_DIMENSION_VERT];
        if (pAVar3->fpos < sVar1) {
          if (sVar1 < pAVar10[-1].fpos) {
            if (uVar2 < 9) {
              pAVar5 = pAVar3;
              for (lVar4 = 0; lVar9 != lVar4; lVar4 = lVar4 + 1) {
                sVar6 = pAVar5->fpos;
                if (sVar1 <= sVar6) goto LAB_0017c0ef;
                pAVar5 = pAVar5 + 1;
              }
              sVar6 = pAVar10->fpos;
              lVar4 = lVar9;
LAB_0017c0ef:
              if (sVar6 == sVar1) {
                lVar4 = pAVar3[lVar4].pos;
                goto LAB_0017c189;
              }
            }
            else {
              lVar4 = 0;
              lVar8 = lVar9;
              while (lVar7 = lVar8, lVar4 < lVar7) {
                lVar8 = lVar7 + lVar4 >> 1;
                if (pAVar3[lVar8].fpos <= sVar1) {
                  if (sVar1 <= pAVar3[lVar8].fpos) {
                    lVar4 = pAVar3[lVar8].pos;
                    goto LAB_0017c189;
                  }
                  lVar4 = lVar8 + 1;
                  lVar8 = lVar7;
                }
              }
            }
            pAVar5 = pAVar3 + lVar4;
            lVar4 = pAVar3[lVar4 + -1].scale;
            if (lVar4 == 0) {
              lVar4 = FT_DivFix(pAVar5->pos - pAVar5[-1].pos,
                                (long)pAVar5->fpos - (long)pAVar5[-1].fpos);
              pAVar5[-1].scale = lVar4;
            }
            lVar4 = (long)(int)lVar4 * ((long)sVar1 - (long)pAVar5[-1].fpos);
            lVar4 = (lVar4 + (lVar4 >> 0x3f) + 0x8000 >> 0x10) + pAVar5[-1].pos;
          }
          else {
            lVar4 = ((&pAVar11->ox)[dim == AF_DIMENSION_VERT] + pAVar10[-1].pos) - pAVar10[-1].opos;
          }
        }
        else {
          lVar4 = ((&pAVar11->ox)[dim == AF_DIMENSION_VERT] + pAVar3->pos) - pAVar3->opos;
        }
LAB_0017c189:
        (&pAVar11->x)[bVar13] = lVar4;
        pAVar11->flags = pAVar11->flags | (ushort)bVar13 * 4 + 4;
      }
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_strong_points( AF_GlyphHints  hints,
                                      AF_Dimension   dim )
  {
    AF_Point      points      = hints->points;
    AF_Point      point_limit = points + hints->num_points;
    AF_AxisHints  axis        = &hints->axis[dim];
    AF_Edge       edges       = axis->edges;
    AF_Edge       edge_limit  = edges + axis->num_edges;
    FT_UInt       touch_flag;


    if ( dim == AF_DIMENSION_HORZ )
      touch_flag = AF_FLAG_TOUCH_X;
    else
      touch_flag  = AF_FLAG_TOUCH_Y;

    if ( edges < edge_limit )
    {
      AF_Point  point;
      AF_Edge   edge;


      for ( point = points; point < point_limit; point++ )
      {
        FT_Pos  u, ou, fu;  /* point position */
        FT_Pos  delta;


        if ( point->flags & touch_flag )
          continue;

        /* if this point is candidate to weak interpolation, we       */
        /* interpolate it after all strong points have been processed */

        if ( ( point->flags & AF_FLAG_WEAK_INTERPOLATION ) )
          continue;

        if ( dim == AF_DIMENSION_VERT )
        {
          u  = point->fy;
          ou = point->oy;
        }
        else
        {
          u  = point->fx;
          ou = point->ox;
        }

        fu = u;

        /* is the point before the first edge? */
        edge  = edges;
        delta = edge->fpos - u;
        if ( delta >= 0 )
        {
          u = edge->pos - ( edge->opos - ou );
          goto Store_Point;
        }

        /* is the point after the last edge? */
        edge  = edge_limit - 1;
        delta = u - edge->fpos;
        if ( delta >= 0 )
        {
          u = edge->pos + ( ou - edge->opos );
          goto Store_Point;
        }

        {
          FT_PtrDist  min, max, mid;
          FT_Pos      fpos;


          /* find enclosing edges */
          min = 0;
          max = edge_limit - edges;

#if 1
          /* for a small number of edges, a linear search is better */
          if ( max <= 8 )
          {
            FT_PtrDist  nn;


            for ( nn = 0; nn < max; nn++ )
              if ( edges[nn].fpos >= u )
                break;

            if ( edges[nn].fpos == u )
            {
              u = edges[nn].pos;
              goto Store_Point;
            }
            min = nn;
          }
          else
#endif
          while ( min < max )
          {
            mid  = ( max + min ) >> 1;
            edge = edges + mid;
            fpos = edge->fpos;

            if ( u < fpos )
              max = mid;
            else if ( u > fpos )
              min = mid + 1;
            else
            {
              /* we are on the edge */
              u = edge->pos;
              goto Store_Point;
            }
          }

          /* point is not on an edge */
          {
            AF_Edge  before = edges + min - 1;
            AF_Edge  after  = edges + min + 0;


            /* assert( before && after && before != after ) */
            if ( before->scale == 0 )
              before->scale = FT_DivFix( after->pos - before->pos,
                                         after->fpos - before->fpos );

            u = before->pos + FT_MulFix( fu - before->fpos,
                                         before->scale );
          }
        }

      Store_Point:
        /* save the point position */
        if ( dim == AF_DIMENSION_HORZ )
          point->x = u;
        else
          point->y = u;

        point->flags |= touch_flag;
      }
    }
  }